

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSum.cpp
# Opt level: O2

void __thiscall NaPNSum::action(NaPNSum *this)

{
  NaVector *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  NaVector *pNVar8;
  NaReal *pNVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NaVector *pNVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  pNVar10 = &this->vMainGain;
  uVar5 = NaVector::dim(pNVar10);
  if (uVar5 != 0) {
    this_00 = &this->vAuxGain;
    uVar5 = NaVector::dim(this_00);
    if (uVar5 != 0) {
      uVar5 = NaVector::dim(pNVar10);
      if ((uVar5 != 1) && (uVar5 = NaVector::dim(this_00), uVar5 != 1)) {
        uVar5 = 0;
        while( true ) {
          pNVar8 = NaPetriCnOutput::data(&this->sum);
          uVar6 = (*pNVar8->_vptr_NaVector[6])(pNVar8);
          if (uVar6 <= uVar5) break;
          pNVar9 = NaVector::operator[](pNVar10,uVar5);
          dVar1 = *pNVar9;
          pNVar8 = NaPetriCnInput::data(&this->main);
          iVar7 = (*pNVar8->_vptr_NaVector[8])(pNVar8,(ulong)uVar5);
          dVar2 = *(double *)CONCAT44(extraout_var_05,iVar7);
          pNVar9 = NaVector::operator[](this_00,uVar5);
          dVar3 = *pNVar9;
          pNVar8 = NaPetriCnInput::data(&this->aux);
          iVar7 = (*pNVar8->_vptr_NaVector[8])(pNVar8,(ulong)uVar5);
          dVar4 = *(double *)CONCAT44(extraout_var_06,iVar7);
          pNVar8 = NaPetriCnOutput::data(&this->sum);
          iVar7 = (*pNVar8->_vptr_NaVector[8])(pNVar8,(ulong)uVar5);
          *(double *)CONCAT44(extraout_var_07,iVar7) = dVar3 * dVar4 + dVar1 * dVar2;
          uVar5 = uVar5 + 1;
        }
        return;
      }
      uVar5 = 0;
      while( true ) {
        pNVar8 = NaPetriCnOutput::data(&this->sum);
        uVar6 = (*pNVar8->_vptr_NaVector[6])(pNVar8);
        if (uVar6 <= uVar5) break;
        pNVar9 = NaVector::operator[](pNVar10,0);
        dVar1 = *pNVar9;
        pNVar8 = NaPetriCnInput::data(&this->main);
        iVar7 = (*pNVar8->_vptr_NaVector[8])(pNVar8);
        dVar2 = *(double *)CONCAT44(extraout_var,iVar7);
        pNVar9 = NaVector::operator[](this_00,0);
        dVar3 = *pNVar9;
        pNVar8 = NaPetriCnInput::data(&this->aux);
        iVar7 = (*pNVar8->_vptr_NaVector[8])(pNVar8,(ulong)uVar5);
        dVar4 = *(double *)CONCAT44(extraout_var_00,iVar7);
        pNVar8 = NaPetriCnOutput::data(&this->sum);
        iVar7 = (*pNVar8->_vptr_NaVector[8])(pNVar8);
        *(double *)CONCAT44(extraout_var_01,iVar7) = dVar3 * dVar4 + dVar1 * dVar2;
        uVar5 = uVar5 + 1;
      }
      return;
    }
  }
  uVar5 = 0;
  while( true ) {
    pNVar10 = NaPetriCnOutput::data(&this->sum);
    uVar6 = (*pNVar10->_vptr_NaVector[6])(pNVar10);
    if (uVar6 <= uVar5) break;
    pNVar10 = NaPetriCnInput::data(&this->main);
    iVar7 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)uVar5);
    dVar1 = *(double *)CONCAT44(extraout_var_02,iVar7);
    pNVar10 = NaPetriCnInput::data(&this->aux);
    iVar7 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)uVar5);
    dVar2 = *(double *)CONCAT44(extraout_var_03,iVar7);
    pNVar10 = NaPetriCnOutput::data(&this->sum);
    iVar7 = (*pNVar10->_vptr_NaVector[8])(pNVar10,(ulong)uVar5);
    *(double *)CONCAT44(extraout_var_04,iVar7) = dVar1 + dVar2;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void
NaPNSum::action ()
{
    unsigned    i;

    if(0 == vMainGain.dim() || 0 == vAuxGain.dim())
      {
	/* vMainGain[i]=1 and vAuxGain[i]=1 by default */
	for(i = 0; i < sum.data().dim(); ++i)
	  sum.data()[i] = main.data()[i] + aux.data()[i];
      }
    else if(1 == vMainGain.dim() || 1 == vAuxGain.dim())
      {
	/* vMainGain[0]=k1 and vAuxGain[0]=k2 by default */
	for(i = 0; i < sum.data().dim(); ++i)
	  sum.data()[i] =
	    vMainGain[0] * main.data()[i]
	    + vAuxGain[0] * aux.data()[i];
      }
    else
      {
	for(i = 0; i < sum.data().dim(); ++i)
	  sum.data()[i] =
	    vMainGain[i] * main.data()[i]
	    + vAuxGain[i] * aux.data()[i];
      }
}